

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_port.hpp
# Opt level: O2

iu_uint_max_t iutest::internal::posix::FileSizeBySeekSet(FILE *fp)

{
  int iVar1;
  __off64_t __off;
  iu_uint_max_t iVar2;
  
  if (((fp != (FILE *)0x0) && (__off = ftello64((FILE *)fp), __off != -1)) &&
     (iVar1 = fseeko64((FILE *)fp,0,2), iVar1 == 0)) {
    iVar2 = ftello64((FILE *)fp);
    fseeko64((FILE *)fp,__off,0);
    return iVar2;
  }
  return 0;
}

Assistant:

inline iu_uint_max_t FileSizeBySeekSet(FILE* fp)
{
    if( fp == NULL )
    {
        return 0;
    }
    const iu_off_t pre = FileTell(fp);
    if( (pre != -1) && (FileSeek(fp, 0, SEEK_END) == 0) )
    {
        const iu_off_t size = FileTell(fp);
        IUTEST_UNUSED_RETURN(FileSeek(fp, pre, SEEK_SET));
        return static_cast<iu_uint_max_t>(size);
    }
    return 0;
}